

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O0

QByteArray * qdtoAscii(double d,DoubleForm form,int precision,bool uppercase)

{
  QByteArray *in_RDI;
  bool in_stack_000000c3;
  DoubleForm in_stack_000000c4;
  int in_stack_00000204;
  double in_stack_00000208;
  
  dtoString<QByteArray>(in_stack_00000208,in_stack_000000c4,in_stack_00000204,in_stack_000000c3);
  return in_RDI;
}

Assistant:

QByteArray qdtoAscii(double d, QLocaleData::DoubleForm form, int precision, bool uppercase)
{
    return dtoString<QByteArray>(d, form, precision, uppercase);
}